

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

TranslationBlock_conflict *
tb_gen_code_tricore(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                   uint32_t flags,int cflags)

{
  ushort uVar1;
  undefined4 uVar2;
  TCGContext_conflict6 *s;
  CPUArchState_conflict30 *env;
  void *pvVar3;
  TCGContext_conflict6 *pTVar4;
  uint8_t *puVar5;
  uc_struct_conflict7 *uc;
  tb_page_addr_t phys1;
  uint32_t uVar6;
  TranslationBlock *tb;
  uint8_t *p_00;
  tb_page_addr_t phys2;
  bool bVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  TranslationBlock *pTVar12;
  uint local_ac;
  PageDesc *p2;
  uint32_t local_7c;
  target_ulong_conflict local_78;
  uint32_t local_74;
  void *local_70;
  PageDesc *p;
  CPUArchState_conflict30 *local_60;
  tb_page_addr_t local_58;
  uint8_t *local_50;
  void *local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  s = cpu->uc->tcg_ctx;
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  local_78 = cs_base;
  local_74 = flags;
  local_58 = get_page_addr_code_tricore(env,pc);
  uVar10 = cflags | 0x10000;
  if (local_58 != 0xffffffffffffffff) {
    uVar10 = cflags;
  }
  local_7c = cpu->cluster_index << 0x18 | uVar10 & 0xffffff;
  uVar10 = uVar10 & 0x7fff;
  uVar9 = 0x200;
  if (uVar10 < 0x200) {
    uVar9 = uVar10;
  }
  if (uVar10 == 0) {
    uVar9 = 0x200;
  }
  local_ac = 1;
  if (cpu->singlestep_enabled == 0) {
    local_ac = uVar9;
  }
  local_40 = (CPUState *)&env[-0x32].cpu_model;
  local_60 = env;
LAB_00b36032:
  do {
    tb = tcg_tb_alloc_tricore((TCGContext_conflict9 *)s);
    if (tb == (TranslationBlock *)0x0) {
      tb_flush_tricore(cpu);
      cpu->exception_index = 0x10000;
      cpu_loop_exit_tricore((CPUState_conflict *)cpu);
    }
    pvVar3 = s->code_gen_ptr;
    *(void **)&tb->cflags = pvVar3;
    *(target_ulong_conflict *)&tb->pc = pc;
    *(target_ulong_conflict *)((long)&tb->pc + 4) = local_78;
    *(uint32_t *)&tb->cs_base = local_74;
    tb->flags = local_7c;
    (tb->tc).size = 0;
    uVar2 = (undefined4)cpu->trace_dstate[0];
    tb->size = (short)uVar2;
    tb->icount = (short)((uint)uVar2 >> 0x10);
    s->tb_cflags = local_7c;
    while( true ) {
      tcg_func_start_tricore((TCGContext_conflict9 *)s);
      s->cpu = local_40;
      gen_intermediate_code_tricore
                ((CPUState_conflict *)cpu,(TranslationBlock_conflict *)tb,local_ac);
      s->cpu = (CPUState *)0x0;
      *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
      s->tb_jmp_reset_offset = (uint16_t *)(tb->page_addr + 1);
      s->tb_jmp_insn_offset = (uintptr_t *)tb->jmp_reset_offset;
      s->tb_jmp_target_addr = (uintptr_t *)0x0;
      uVar10 = tcg_gen_code_tricore((TCGContext_conflict9 *)s,tb);
      if (-1 < (int)uVar10) break;
      if (uVar10 != 0xfffffffe) {
        if (uVar10 != 0xffffffff) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x711,(char *)0x0);
        }
        goto LAB_00b36032;
      }
      uVar1 = *(ushort *)((long)&tb->cs_base + 6);
      local_ac = (uint)(uVar1 >> 1);
      if (uVar1 < 2) {
        __assert_fail("max_insns > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x70c,
                      "TranslationBlock *tb_gen_code_tricore(CPUState *, target_ulong, target_ulong, uint32_t, int)"
                     );
      }
    }
    local_48 = (void *)(ulong)uVar10;
    p_00 = (uint8_t *)((long)local_48 + (long)pvVar3);
    pTVar4 = cpu->uc->tcg_ctx;
    puVar5 = (uint8_t *)pTVar4->code_gen_highwater;
    uVar1 = *(ushort *)((long)&tb->cs_base + 6);
    uVar11 = 0;
    local_70 = pvVar3;
    local_50 = p_00;
    do {
      if (uVar11 == uVar1) {
        uVar10 = (int)p_00 - (int)local_50;
        if (-1 < (int)uVar10) {
          (tb->tc).ptr = local_48;
          s->code_gen_ptr =
               (void *)((long)local_70 + (long)local_48 + (ulong)(uVar10 & 0x7fffffff) + 0xf &
                       0xfffffffffffffff0);
          tb->jmp_dest[0] = 0;
          tb->jmp_list_next[0] = 0;
          tb->jmp_list_next[1] = 0;
          *(undefined1 (*) [16])(tb->jmp_target_arg + 1) = (undefined1  [16])0x0;
          if ((short)tb->page_addr[1] != -1) {
            tb_reset_jump((TranslationBlock_conflict *)tb,0);
          }
          phys1 = local_58;
          if (*(short *)((long)tb->page_addr + 10) != -1) {
            tb_reset_jump((TranslationBlock_conflict *)tb,1);
          }
          uVar10 = (pc + *(ushort *)((long)&tb->cs_base + 4)) - 1 & 0xffffc000;
          if ((pc & 0xffffc000) == uVar10) {
            phys2 = 0xffffffffffffffff;
          }
          else {
            phys2 = get_page_addr_code_tricore(local_60,uVar10);
          }
          uc = cpu->uc;
          p2 = (PageDesc *)0x0;
          if (phys1 == 0xffffffffffffffff) {
            if ((tb->flags & 0x10000) == 0) {
              __assert_fail("tb->cflags & CF_NOCACHE",
                            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                            ,0x66c,
                            "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                           );
            }
            *(undefined4 *)(tb->page_next + 1) = 0xffffffff;
            *(undefined4 *)((long)tb->page_next + 0xc) = 0xffffffff;
            *(undefined4 *)tb->page_addr = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
          }
          else {
            page_lock_pair((uc_struct_conflict15 *)uc,&p,phys1,&p2,phys2,1);
            tb_page_add((uc_struct_conflict15 *)uc,p,(TranslationBlock_conflict *)tb,0,
                        (ulong)((uint)phys1 & 0xffffc000));
            if (p2 == (PageDesc *)0x0) {
              tb->page_addr[0] = 0xffffffffffffffff;
            }
            else {
              tb_page_add((uc_struct_conflict15 *)uc,p2,(TranslationBlock_conflict *)tb,1,phys2);
            }
            if ((tb->flags >> 0x10 & 1) == 0) {
              local_38 = (TranslationBlock *)0x0;
              uVar6._0_2_ = tb->size;
              uVar6._2_2_ = tb->icount;
              uVar6 = tb_hash_func(phys1,(target_ulong_conflict)tb->pc,(uint32_t)tb->cs_base,
                                   tb->flags & 0xff0affff,uVar6);
              *(uint32_t *)(tb->jmp_dest + 1) = uVar6;
              qht_insert((uc_struct_conflict5 *)uc,(qht *)(uc->tcg_ctx->gen_insn_data[0x55] + 1),tb,
                         uVar6,&local_38);
              if (local_38 != (TranslationBlock *)0x0) {
                tb_page_remove(p,(TranslationBlock_conflict *)tb);
                invalidate_page_bitmap(p);
                if (p2 != (PageDesc *)0x0) {
                  tb_page_remove(p2,(TranslationBlock_conflict *)tb);
                  invalidate_page_bitmap(p2);
                }
                if (local_38 != tb) {
                  lVar8 = (long)((uc_struct_conflict10 *)s->gen_insn_data[0x5d][0])->
                                qemu_icache_linesize;
                  s->code_gen_ptr = (void *)((long)local_70 - (-lVar8 & lVar8 + 0x97U));
                  return (TranslationBlock_conflict *)local_38;
                }
              }
            }
          }
          tcg_tb_insert_tricore((TCGContext_conflict9 *)s,tb);
          return (TranslationBlock_conflict *)tb;
        }
        break;
      }
      pTVar12 = (TranslationBlock *)((long)(pTVar4->gen_insn_data + -1) + (uVar11 * 2 + 10) * 2);
      if (uVar11 == 0) {
        pTVar12 = tb;
      }
      bVar7 = true;
      while (bVar7) {
        p_00 = encode_sleb128(p_00,*(int *)((long)pTVar4->gen_insn_data[0] + uVar11 * 4) -
                                   (int)pTVar12->pc);
        bVar7 = false;
      }
      if (uVar11 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (uint)pTVar4->gen_insn_end_off[uVar11 - 1];
      }
      p_00 = encode_sleb128(p_00,pTVar4->gen_insn_end_off[uVar11] - uVar10);
      uVar11 = uVar11 + 1;
    } while (p_00 <= puVar5);
  } while( true );
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}